

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationDataBuilder::buildContext
          (CollationDataBuilder *this,ConditionalCE32 *head,UErrorCode *errorCode)

{
  short sVar1;
  Normalizer2Impl *pNVar2;
  uint32_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  UChar32 UVar8;
  int32_t iVar9;
  ConditionalCE32 *pCVar10;
  char16_t *pcVar11;
  ConditionalCE32 *pCVar12;
  ushort uVar13;
  int iVar14;
  undefined8 srcChars;
  undefined4 uVar15;
  uint uVar16;
  uint32_t uVar17;
  ConditionalCE32 *pCVar18;
  int srcStart;
  int32_t len_1;
  int iVar19;
  uint srcLength;
  UVector *this_00;
  UnicodeString prefix;
  UCharsTrieBuilder contractionBuilder;
  UnicodeString suffix;
  UCharsTrieBuilder prefixBuilder;
  UnicodeString local_190;
  UCharsTrieBuilder local_150;
  UnicodeString local_e0;
  UCharsTrieBuilder local_a0;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  UCharsTrieBuilder::UCharsTrieBuilder(&local_a0,errorCode);
  UCharsTrieBuilder::UCharsTrieBuilder(&local_150,errorCode);
  this_00 = &this->conditionalCE32s;
  pCVar12 = head;
  do {
    sVar1 = (pCVar12->context).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar14 = (pCVar12->context).fUnion.fFields.fLength;
    }
    else {
      iVar14 = (int)sVar1 >> 5;
    }
    if (iVar14 == 0) {
      uVar6 = 0xffff;
    }
    else {
      if (((int)sVar1 & 2U) == 0) {
        pcVar11 = (pCVar12->context).fUnion.fFields.fArray;
      }
      else {
        pcVar11 = (pCVar12->context).fUnion.fStackFields.fBuffer;
      }
      uVar6 = (uint)(ushort)*pcVar11;
    }
    iVar14 = uVar6 + 1;
    UnicodeString::UnicodeString(&local_190,&pCVar12->context,0,iVar14);
    pCVar10 = pCVar12;
    do {
      pCVar18 = pCVar10;
      if (pCVar18->next < 0) break;
      pCVar10 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar18->next);
      if ((local_190.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar15 = local_190.fUnion.fFields.fLength;
        if (-1 < local_190.fUnion.fStackFields.fLengthAndFlags) {
          uVar15 = (int)local_190.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar19 = 0;
        if ((int)uVar15 < 0) {
          iVar19 = uVar15;
        }
        iVar9 = uVar15 - iVar19;
        if ((int)uVar15 <= uVar15 - iVar19) {
          iVar9 = uVar15;
        }
        if ((int)uVar15 < 0) {
          iVar9 = 0;
        }
        srcChars = local_190.fUnion.fStackFields.fBuffer;
        if ((local_190.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
          srcChars = local_190.fUnion.fFields.fArray;
        }
        bVar4 = UnicodeString::doCompare(&pCVar10->context,0,uVar15,(UChar *)srcChars,iVar19,iVar9);
      }
      else {
        bVar4 = ~*(byte *)&(pCVar10->context).fUnion & 1;
      }
    } while (bVar4 == 0);
    sVar1 = (pCVar18->context).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar19 = (pCVar18->context).fUnion.fFields.fLength;
    }
    else {
      iVar19 = (int)sVar1 >> 5;
    }
    if (iVar19 != iVar14) {
      uVar13 = local_150.strings.fUnion.fStackFields.fLengthAndFlags & 0x1e;
      if ((local_150.strings.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
        uVar13 = 2;
      }
      local_150.elementsLength = 0;
      local_150.ucharsLength = 0;
      sVar1 = (pCVar12->context).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar19 = (pCVar12->context).fUnion.fFields.fLength;
      }
      else {
        iVar19 = (int)sVar1 >> 5;
      }
      local_150.strings.fUnion.fStackFields.fLengthAndFlags = uVar13;
      if (iVar19 == iVar14) {
        uVar17 = pCVar12->ce32;
        pCVar10 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar12->next);
        uVar16 = 0x200;
      }
      else {
        uVar17 = 0;
        pCVar10 = head;
        while( true ) {
          uVar13 = (pCVar10->context).fUnion.fStackFields.fLengthAndFlags;
          if ((short)uVar13 < 0) {
            iVar19 = (pCVar10->context).fUnion.fFields.fLength;
          }
          else {
            iVar19 = (int)(short)uVar13 >> 5;
          }
          if (iVar19 == 0) {
            uVar16 = 0xffff;
          }
          else {
            if ((uVar13 & 2) == 0) {
              pcVar11 = (pCVar10->context).fUnion.fFields.fArray;
            }
            else {
              pcVar11 = (pCVar10->context).fUnion.fStackFields.fBuffer;
            }
            uVar16 = (uint)(ushort)*pcVar11;
          }
          if (uVar16 == uVar6) break;
          uVar3 = uVar17;
          if ((pCVar10->defaultCE32 != 1) && (uVar3 = pCVar10->defaultCE32, uVar16 != 0)) {
            if ((uVar13 & 1) == 0) {
              uVar15 = local_190.fUnion.fFields.fLength;
              if (-1 < local_190.fUnion.fStackFields.fLengthAndFlags) {
                uVar15 = (int)local_190.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              srcStart = 1;
              if (iVar19 < 1) {
                srcStart = iVar19;
              }
              uVar7 = iVar19 - srcStart;
              if ((int)uVar7 < (int)uVar16) {
                uVar16 = uVar7;
              }
              if (srcStart < 1) {
                srcStart = 0;
              }
              srcLength = iVar19 - srcStart;
              if ((int)uVar16 <= iVar19 - srcStart) {
                srcLength = uVar16;
              }
              if ((int)uVar7 < 0) {
                srcLength = 0;
              }
              if ((uVar13 & 2) == 0) {
                pcVar11 = (pCVar10->context).fUnion.fFields.fArray;
              }
              else {
                pcVar11 = (pCVar10->context).fUnion.fStackFields.fBuffer;
              }
              bVar4 = UnicodeString::doCompare
                                (&local_190,uVar15 - uVar16,uVar16,pcVar11,srcStart,srcLength);
            }
            else {
              bVar4 = ~(byte)local_190.fUnion.fStackFields.fLengthAndFlags & 1;
            }
            uVar3 = uVar17;
            if (bVar4 == 0) {
              uVar3 = pCVar10->defaultCE32;
            }
          }
          uVar17 = uVar3;
          pCVar10 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar10->next);
        }
        uVar16 = 0x300;
        pCVar10 = pCVar12;
      }
      while( true ) {
        UnicodeString::UnicodeString(&local_e0,&pCVar10->context,iVar14);
        pNVar2 = this->nfcImpl;
        UVar8 = UnicodeString::char32At(&local_e0,0);
        uVar5 = Normalizer2Impl::getFCD16(pNVar2,UVar8);
        uVar7 = uVar16 & 0xfffffdff;
        if (0xff < uVar5) {
          uVar7 = uVar16;
        }
        uVar15 = local_e0.fUnion.fFields.fLength;
        if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
          uVar15 = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        pNVar2 = this->nfcImpl;
        UVar8 = UnicodeString::char32At(&local_e0,uVar15 + -1);
        uVar5 = Normalizer2Impl::getFCD16(pNVar2,UVar8);
        uVar16 = uVar7 | 0x400;
        if (uVar5 < 0x100) {
          uVar16 = uVar7;
        }
        UCharsTrieBuilder::add(&local_150,&local_e0,pCVar10->ce32,errorCode);
        if (pCVar10 == pCVar18) break;
        pCVar10 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar10->next);
        UnicodeString::~UnicodeString(&local_e0);
      }
      UnicodeString::~UnicodeString(&local_e0);
      iVar9 = addContextTrie(this,uVar17,&local_150,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (iVar9 < 0x80000) {
          uVar17 = uVar16 | iVar9 << 0xd | 0xc9;
          goto LAB_0023b294;
        }
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      uVar17 = 0;
LAB_0023b36b:
      UnicodeString::~UnicodeString(&local_190);
      goto LAB_0023b375;
    }
    uVar17 = pCVar18->ce32;
    pCVar10 = pCVar18;
LAB_0023b294:
    pCVar12->defaultCE32 = uVar17;
    if (uVar6 == 0) {
      if (pCVar10->next < 0) goto LAB_0023b36b;
    }
    else {
      UnicodeString::doReplace(&local_190,0,1,(UChar *)0x0,0,0);
      uVar15 = local_190.fUnion.fFields.fLength;
      if (-1 < local_190.fUnion.fStackFields.fLengthAndFlags) {
        uVar15 = (int)local_190.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doReverse(&local_190,0,uVar15);
      UCharsTrieBuilder::add(&local_a0,&local_190,uVar17,errorCode);
      if (pCVar10->next < 0) {
        UnicodeString::~UnicodeString(&local_190);
        iVar9 = addContextTrie(this,head->defaultCE32,&local_a0,errorCode);
        uVar17 = 0;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if (iVar9 < 0x80000) {
            uVar17 = iVar9 << 0xd | 200;
          }
          else {
            *errorCode = U_BUFFER_OVERFLOW_ERROR;
          }
        }
LAB_0023b375:
        UCharsTrieBuilder::~UCharsTrieBuilder(&local_150);
        UCharsTrieBuilder::~UCharsTrieBuilder(&local_a0);
        return uVar17;
      }
    }
    UnicodeString::~UnicodeString(&local_190);
    pCVar12 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar10->next);
  } while( true );
}

Assistant:

uint32_t
CollationDataBuilder::buildContext(ConditionalCE32 *head, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // The list head must have no context.
    U_ASSERT(!head->hasContext());
    // The list head must be followed by one or more nodes that all do have context.
    U_ASSERT(head->next >= 0);
    UCharsTrieBuilder prefixBuilder(errorCode);
    UCharsTrieBuilder contractionBuilder(errorCode);
    for(ConditionalCE32 *cond = head;; cond = getConditionalCE32(cond->next)) {
        // After the list head, the prefix or suffix can be empty, but not both.
        U_ASSERT(cond == head || cond->hasContext());
        int32_t prefixLength = cond->prefixLength();
        UnicodeString prefix(cond->context, 0, prefixLength + 1);
        // Collect all contraction suffixes for one prefix.
        ConditionalCE32 *firstCond = cond;
        ConditionalCE32 *lastCond = cond;
        while(cond->next >= 0 &&
                (cond = getConditionalCE32(cond->next))->context.startsWith(prefix)) {
            lastCond = cond;
        }
        uint32_t ce32;
        int32_t suffixStart = prefixLength + 1;  // == prefix.length()
        if(lastCond->context.length() == suffixStart) {
            // One prefix without contraction suffix.
            U_ASSERT(firstCond == lastCond);
            ce32 = lastCond->ce32;
            cond = lastCond;
        } else {
            // Build the contractions trie.
            contractionBuilder.clear();
            // Entry for an empty suffix, to be stored before the trie.
            uint32_t emptySuffixCE32 = 0;
            uint32_t flags = 0;
            if(firstCond->context.length() == suffixStart) {
                // There is a mapping for the prefix and the single character c. (p|c)
                // If no other suffix matches, then we return this value.
                emptySuffixCE32 = firstCond->ce32;
                cond = getConditionalCE32(firstCond->next);
            } else {
                // There is no mapping for the prefix and just the single character.
                // (There is no p|c, only p|cd, p|ce etc.)
                flags |= Collation::CONTRACT_SINGLE_CP_NO_MATCH;
                // When the prefix matches but none of the prefix-specific suffixes,
                // then we fall back to the mappings with the next-longest prefix,
                // and ultimately to mappings with no prefix.
                // Each fallback might be another set of contractions.
                // For example, if there are mappings for ch, p|cd, p|ce, but not for p|c,
                // then in text "pch" we find the ch contraction.
                for(cond = head;; cond = getConditionalCE32(cond->next)) {
                    int32_t length = cond->prefixLength();
                    if(length == prefixLength) { break; }
                    if(cond->defaultCE32 != Collation::NO_CE32 &&
                            (length==0 || prefix.endsWith(cond->context, 1, length))) {
                        emptySuffixCE32 = cond->defaultCE32;
                    }
                }
                cond = firstCond;
            }
            // Optimization: Set a flag when
            // the first character of every contraction suffix has lccc!=0.
            // Short-circuits contraction matching when a normal letter follows.
            flags |= Collation::CONTRACT_NEXT_CCC;
            // Add all of the non-empty suffixes into the contraction trie.
            for(;;) {
                UnicodeString suffix(cond->context, suffixStart);
                uint16_t fcd16 = nfcImpl.getFCD16(suffix.char32At(0));
                if(fcd16 <= 0xff) {
                    flags &= ~Collation::CONTRACT_NEXT_CCC;
                }
                fcd16 = nfcImpl.getFCD16(suffix.char32At(suffix.length() - 1));
                if(fcd16 > 0xff) {
                    // The last suffix character has lccc!=0, allowing for discontiguous contractions.
                    flags |= Collation::CONTRACT_TRAILING_CCC;
                }
                contractionBuilder.add(suffix, (int32_t)cond->ce32, errorCode);
                if(cond == lastCond) { break; }
                cond = getConditionalCE32(cond->next);
            }
            int32_t index = addContextTrie(emptySuffixCE32, contractionBuilder, errorCode);
            if(U_FAILURE(errorCode)) { return 0; }
            if(index > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            ce32 = Collation::makeCE32FromTagAndIndex(Collation::CONTRACTION_TAG, index) | flags;
        }
        U_ASSERT(cond == lastCond);
        firstCond->defaultCE32 = ce32;
        if(prefixLength == 0) {
            if(cond->next < 0) {
                // No non-empty prefixes, only contractions.
                return ce32;
            }
        } else {
            prefix.remove(0, 1);  // Remove the length unit.
            prefix.reverse();
            prefixBuilder.add(prefix, (int32_t)ce32, errorCode);
            if(cond->next < 0) { break; }
        }
    }
    U_ASSERT(head->defaultCE32 != Collation::NO_CE32);
    int32_t index = addContextTrie(head->defaultCE32, prefixBuilder, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    return Collation::makeCE32FromTagAndIndex(Collation::PREFIX_TAG, index);
}